

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

bool __thiscall
QGraphicsViewPrivate::updateRegion(QGraphicsViewPrivate *this,QRectF *rect,QTransform *xform)

{
  uint uVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  bool bVar8;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  QRegion region;
  QRegion local_70;
  undefined1 local_68 [8];
  Representation RStack_60;
  Representation RStack_5c;
  double local_58;
  double local_50;
  undefined1 *local_48;
  long lStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = false;
  if ((0.0 < rect->w) && (bVar8 = false, 0.0 < rect->h)) {
    if (this->viewportUpdateMode - MinimalViewportUpdate < 2) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      auVar14 = QRectF::toAlignedRect();
      local_68._0_4_ = auVar14._0_4_;
      local_68._4_4_ = auVar14._4_4_;
      RStack_60.m_i = auVar14._8_4_;
      RStack_5c.m_i = auVar14._12_4_;
      QRegion::QRegion(&local_70,(QRect *)local_68,Rectangle);
      QTransform::map((QRegion *)&local_48);
      QRegion::~QRegion(&local_70);
      auVar14 = QRegion::boundingRect();
      uVar1 = (this->optimizationFlags).
              super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
              super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i;
      uVar7 = uVar1 & 2;
      lVar9 = 0x200000000;
      if (uVar7 != 0) {
        lVar9 = 0x100000000;
      }
      pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      bVar3 = (int)((-(uint)(uVar7 != 0) | 0xfffffffe) + auVar14._0_4_) <=
              ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
      bVar10 = -1 < (int)((uint)(uVar7 == 0) + auVar14._8_4_ + 1);
      bVar4 = (int)((((ulong)(uVar1 >> 1) | 0xfffffffffffffffe) << 0x20) + auVar14._0_8_ >> 0x20) <
              ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1;
      bVar11 = -1 < lVar9 + auVar14._8_8_;
      bVar8 = (bVar11 && bVar3) && (bVar4 && bVar10);
      if ((bVar11 && bVar3) && (bVar4 && bVar10)) {
        puVar5 = (undefined8 *)QRegion::begin();
        puVar6 = (undefined8 *)QRegion::end();
        if (puVar5 != puVar6) {
          do {
            local_68._0_4_ = (undefined4)*puVar5;
            local_68._4_4_ = (undefined4)((ulong)*puVar5 >> 0x20);
            RStack_60.m_i = (int)puVar5[1];
            RStack_5c.m_i = (int)((ulong)puVar5[1] >> 0x20);
            uVar12 = 0x2fffffffe;
            if (uVar7 != 0) {
              uVar12 = 0x1ffffffff;
            }
            local_68._0_4_ = local_68._0_4_ + (-(uint)(uVar7 != 0) | 0xfffffffe);
            local_68._4_4_ = local_68._4_4_ + (int)uVar12;
            iVar13 = (int)((ulong)uVar12 >> 0x20);
            RStack_60.m_i = RStack_60.m_i + iVar13;
            RStack_5c.m_i = RStack_5c.m_i + iVar13;
            if ((this->field_0x301 & 0x20) != 0) {
              auVar14 = QRect::operator&((QRect *)local_68,&this->updateClip);
              local_68._0_4_ = auVar14._0_4_;
              local_68._4_4_ = auVar14._4_4_;
              RStack_60.m_i = auVar14._8_4_;
              RStack_5c.m_i = auVar14._12_4_;
            }
            QRegion::operator+=(&this->dirtyRegion,(QRect *)local_68);
            puVar5 = puVar5 + 2;
          } while (puVar5 != puVar6);
        }
      }
      QRegion::~QRegion((QRegion *)&local_48);
    }
    else {
      QTransform::mapRect((QRectF *)local_68);
      bVar8 = false;
      if ((0.0 < local_58) && (0.0 < local_50)) {
        if (((this->optimizationFlags).super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>
             .super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
          auVar14 = QRectF::toAlignedRect();
          auVar15._12_4_ = auVar14._12_4_;
          auVar15._0_4_ = (undefined4)(auVar14._0_8_ + 0xfffffffe);
          auVar15._8_4_ = (undefined4)(auVar14._8_8_ + 2);
          auVar15._4_4_ = auVar15._8_4_;
          local_48 = (undefined1 *)(CONCAT44(auVar14._4_4_,auVar15._0_4_) + -0x200000000);
          lStack_40 = auVar15._8_8_ + 0x200000000;
        }
        else {
          auVar15 = QRectF::toAlignedRect();
          auVar14._12_4_ = auVar15._12_4_;
          auVar14._0_4_ = (undefined4)(auVar15._0_8_ + 0xffffffff);
          auVar14._8_4_ = (undefined4)(auVar15._8_8_ + 1);
          auVar14._4_4_ = auVar14._8_4_;
          local_48 = (undefined1 *)(CONCAT44(auVar15._4_4_,auVar14._0_4_) + -0x100000000);
          lStack_40 = auVar14._8_8_ + 0x100000000;
        }
        bVar8 = updateRect(this,(QRect *)&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::updateRegion(const QRectF &rect, const QTransform &xform)
{
    if (rect.isEmpty())
        return false;

    if (viewportUpdateMode != QGraphicsView::MinimalViewportUpdate
        && viewportUpdateMode != QGraphicsView::SmartViewportUpdate) {
        // No point in updating with QRegion granularity; use the rect instead.
        return updateRectF(xform.mapRect(rect));
    }

    // Update mode is either Minimal or Smart, so we have to do a potentially slow operation,
    // which is clearly documented here: QGraphicsItem::setBoundingRegionGranularity.
    const QRegion region = xform.map(QRegion(rect.toAlignedRect()));
    QRect viewRect = region.boundingRect();
    const bool dontAdjustForAntialiasing = optimizationFlags & QGraphicsView::DontAdjustForAntialiasing;
    if (dontAdjustForAntialiasing)
        viewRect.adjust(-1, -1, 1, 1);
    else
        viewRect.adjust(-2, -2, 2, 2);
    if (!intersectsViewport(viewRect, viewport->width(), viewport->height()))
        return false; // Update region for sure outside viewport.

    for (QRect viewRect : region) {
        if (dontAdjustForAntialiasing)
            viewRect.adjust(-1, -1, 1, 1);
        else
            viewRect.adjust(-2, -2, 2, 2);
        if (hasUpdateClip)
            viewRect &= updateClip;
        dirtyRegion += viewRect;
    }

    return true;
}